

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O3

int uv_interface_addresses(uv_interface_address_t **addresses,int *count)

{
  short *psVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  uv_interface_address_t *puVar7;
  char *pcVar8;
  long *plVar9;
  long *plVar10;
  int iVar11;
  undefined4 uVar12;
  in_addr_t iVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  ifaddrs *addrs;
  long *local_48;
  long *local_40;
  uv_interface_address_t **local_38;
  
  iVar4 = getifaddrs(&local_48);
  if (iVar4 != 0) {
    piVar6 = __errno_location();
    return -*piVar6;
  }
  *count = 0;
  *addresses = (uv_interface_address_t *)0x0;
  if (local_48 == (long *)0x0) {
    return 0;
  }
  iVar4 = 0;
  plVar9 = local_48;
  do {
    if ((((~*(uint *)(plVar9 + 2) & 0x41) == 0) && ((short *)plVar9[3] != (short *)0x0)) &&
       (*(short *)plVar9[3] != 0x11)) {
      iVar4 = iVar4 + 1;
      *count = iVar4;
    }
    plVar9 = (long *)*plVar9;
  } while (plVar9 != (long *)0x0);
  if (iVar4 == 0) {
    return 0;
  }
  puVar7 = (uv_interface_address_t *)uv__malloc((long)iVar4 * 0x50);
  *addresses = puVar7;
  if (puVar7 == (uv_interface_address_t *)0x0) {
    freeifaddrs(local_48);
    return -0xc;
  }
  plVar9 = local_48;
  if (local_48 != (long *)0x0) {
    do {
      if ((((~*(uint *)(plVar9 + 2) & 0x41) == 0) && ((short *)plVar9[3] != (short *)0x0)) &&
         (*(short *)plVar9[3] != 0x11)) {
        pcVar8 = uv__strdup((char *)plVar9[1]);
        puVar7->name = pcVar8;
        psVar1 = (short *)plVar9[3];
        if (*psVar1 == 10) {
          uVar12 = *(undefined4 *)psVar1;
          iVar13 = *(in_addr_t *)(psVar1 + 2);
          uVar14 = *(undefined4 *)(psVar1 + 4);
          uVar15 = *(undefined4 *)(psVar1 + 6);
          uVar3 = *(undefined8 *)(psVar1 + 10);
          *(undefined8 *)((long)&puVar7->address + 0xc) = *(undefined8 *)(psVar1 + 6);
          *(undefined8 *)((long)&puVar7->address + 0x14) = uVar3;
        }
        else {
          uVar12 = *(undefined4 *)psVar1;
          iVar13 = *(in_addr_t *)(psVar1 + 2);
          uVar14 = *(undefined4 *)(psVar1 + 4);
          uVar15 = *(undefined4 *)(psVar1 + 6);
        }
        *(undefined4 *)&puVar7->address = uVar12;
        (puVar7->address).address4.sin_addr.s_addr = iVar13;
        *(undefined4 *)((long)&puVar7->address + 8) = uVar14;
        *(undefined4 *)((long)&puVar7->address + 0xc) = uVar15;
        psVar1 = (short *)plVar9[4];
        if (*psVar1 == 10) {
          uVar12 = *(undefined4 *)psVar1;
          iVar13 = *(in_addr_t *)(psVar1 + 2);
          uVar14 = *(undefined4 *)(psVar1 + 4);
          uVar15 = *(undefined4 *)(psVar1 + 6);
          uVar3 = *(undefined8 *)(psVar1 + 10);
          *(undefined8 *)((long)&puVar7->netmask + 0xc) = *(undefined8 *)(psVar1 + 6);
          *(undefined8 *)((long)&puVar7->netmask + 0x14) = uVar3;
        }
        else {
          uVar12 = *(undefined4 *)psVar1;
          iVar13 = *(in_addr_t *)(psVar1 + 2);
          uVar14 = *(undefined4 *)(psVar1 + 4);
          uVar15 = *(undefined4 *)(psVar1 + 6);
        }
        *(undefined4 *)&puVar7->netmask = uVar12;
        (puVar7->netmask).netmask4.sin_addr.s_addr = iVar13;
        *(undefined4 *)((long)&puVar7->netmask + 8) = uVar14;
        *(undefined4 *)((long)&puVar7->netmask + 0xc) = uVar15;
        puVar7->is_internal = *(uint *)(plVar9 + 2) >> 3 & 1;
        puVar7 = puVar7 + 1;
      }
      plVar9 = (long *)*plVar9;
    } while (plVar9 != (long *)0x0);
    if (local_48 != (long *)0x0) {
      local_40 = local_48;
      plVar9 = local_48;
      local_38 = addresses;
      do {
        if ((((~*(uint *)(plVar9 + 2) & 0x41) == 0) && ((short *)plVar9[3] != (short *)0x0)) &&
           ((*(short *)plVar9[3] != 0x11 && (iVar4 = *count, 0 < iVar4)))) {
          pcVar8 = (*local_38)->phys_addr;
          iVar11 = 0;
          do {
            iVar5 = strcmp(((uv_interface_address_t *)(pcVar8 + -8))->name,(char *)plVar9[1]);
            if (iVar5 == 0) {
              lVar2 = plVar9[3];
              *(undefined2 *)(pcVar8 + 4) = *(undefined2 *)(lVar2 + 0x10);
              *(undefined4 *)pcVar8 = *(undefined4 *)(lVar2 + 0xc);
              iVar4 = *count;
            }
            iVar11 = iVar11 + 1;
            pcVar8 = pcVar8 + 0x50;
          } while (iVar11 < iVar4);
        }
        plVar9 = (long *)*plVar9;
        plVar10 = local_40;
      } while (plVar9 != (long *)0x0);
      goto LAB_005e42d9;
    }
  }
  plVar10 = (long *)0x0;
LAB_005e42d9:
  freeifaddrs(plVar10);
  return 0;
}

Assistant:

int uv_interface_addresses(uv_interface_address_t** addresses,
  int* count) {
#ifndef HAVE_IFADDRS_H
  return -ENOSYS;
#else
  struct ifaddrs *addrs, *ent;
  uv_interface_address_t* address;
  int i;
  struct sockaddr_ll *sll;

  if (getifaddrs(&addrs))
    return -errno;

  *count = 0;
  *addresses = NULL;

  /* Count the number of interfaces */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent))
      continue;

    (*count)++;
  }

  if (*count == 0)
    return 0;

  *addresses = uv__malloc(*count * sizeof(**addresses));
  if (!(*addresses)) {
    freeifaddrs(addrs);
    return -ENOMEM;
  }

  address = *addresses;

  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent))
      continue;

    address->name = uv__strdup(ent->ifa_name);

    if (ent->ifa_addr->sa_family == AF_INET6) {
      address->address.address6 = *((struct sockaddr_in6*) ent->ifa_addr);
    } else {
      address->address.address4 = *((struct sockaddr_in*) ent->ifa_addr);
    }

    if (ent->ifa_netmask->sa_family == AF_INET6) {
      address->netmask.netmask6 = *((struct sockaddr_in6*) ent->ifa_netmask);
    } else {
      address->netmask.netmask4 = *((struct sockaddr_in*) ent->ifa_netmask);
    }

    address->is_internal = !!(ent->ifa_flags & IFF_LOOPBACK);

    address++;
  }

  /* Fill in physical addresses for each interface */
  for (ent = addrs; ent != NULL; ent = ent->ifa_next) {
    if (uv__ifaddr_exclude(ent))
      continue;

    address = *addresses;

    for (i = 0; i < (*count); i++) {
      if (strcmp(address->name, ent->ifa_name) == 0) {
        sll = (struct sockaddr_ll*)ent->ifa_addr;
        memcpy(address->phys_addr, sll->sll_addr, sizeof(address->phys_addr));
      }
      address++;
    }
  }

  freeifaddrs(addrs);

  return 0;
#endif
}